

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O3

void __thiscall
soplex::
SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solve3right4update
          (SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *x,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *y2,SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *b,
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *rhs,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *rhs2)

{
  uint uVar1;
  int iVar2;
  int *ridx;
  int *piVar3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *rhs2_00;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer pnVar4;
  int *piVar5;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar6;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar7;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar8;
  pointer pnVar9;
  int *piVar10;
  pointer pnVar11;
  Real a;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps2_00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps3;
  undefined1 auVar12 [56];
  int iVar13;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *v;
  pointer pnVar14;
  undefined4 in_stack_fffffffffffffd64;
  undefined8 in_stack_fffffffffffffd88;
  undefined4 uVar15;
  undefined8 uStack_258;
  undefined4 uStack_24c;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *__range2;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *__range2_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  int f;
  uint local_1a8 [2];
  uint auStack_1a0 [2];
  uint local_198 [2];
  uint auStack_190 [4];
  int local_180;
  undefined1 local_17c;
  fpclass_type local_178;
  int32_t local_174;
  uint local_168 [2];
  uint auStack_160 [2];
  uint local_158 [2];
  undefined8 uStack_150;
  undefined8 local_148;
  int local_140;
  undefined1 local_13c;
  fpclass_type local_138;
  int32_t local_134;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  uint local_e8 [2];
  uint auStack_e0 [2];
  uint local_d8 [2];
  undefined8 uStack_d0;
  undefined8 local_c8;
  int local_c0;
  undefined1 local_bc;
  fpclass_type local_b8;
  int32_t local_b4;
  uint local_a8 [2];
  uint auStack_a0 [2];
  uint local_98 [2];
  undefined8 uStack_90;
  undefined8 local_88;
  int local_80;
  undefined1 local_7c;
  fpclass_type local_78;
  int32_t local_74;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  uVar15 = (undefined4)((ulong)in_stack_fffffffffffffd88 >> 0x20);
  uStack_24c = (undefined4)((ulong)b >> 0x20);
  (*this->solveTime->_vptr_Timer[3])();
  ridx = (this->ssvec).super_IdxSet.idx;
  (this->ssvec).super_IdxSet.num = 0;
  (this->ssvec).setupStatus = true;
  iVar13 = (rhs->super_IdxSet).num;
  rhs->setupStatus = false;
  piVar3 = (rhs->super_IdxSet).idx;
  uVar1 = (rhs2->super_IdxSet).num;
  rhs2->setupStatus = false;
  rhs2_00 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)(rhs2->super_IdxSet).idx;
  this_00 = (this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (this->
            super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  a = Tolerances::epsilon(this_00);
  epsilon.m_backend.fpclass = cpp_dec_float_finite;
  epsilon.m_backend.prec_elem = 10;
  epsilon.m_backend.data._M_elems[0] = 0;
  epsilon.m_backend.data._M_elems[1] = 0;
  epsilon.m_backend.data._M_elems[2] = 0;
  epsilon.m_backend.data._M_elems[3] = 0;
  epsilon.m_backend.data._M_elems[4] = 0;
  epsilon.m_backend.data._M_elems[5] = 0;
  epsilon.m_backend.data._M_elems._24_5_ = 0;
  epsilon.m_backend.data._M_elems[7]._1_3_ = 0;
  epsilon.m_backend.data._M_elems._32_5_ = 0;
  epsilon.m_backend.data._M_elems[9]._1_3_ = 0;
  epsilon.m_backend.exp = 0;
  epsilon.m_backend._44_4_ = epsilon.m_backend._44_4_ & 0xffffff00;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&epsilon,a);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(x);
  pnVar4 = (y->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pnVar14 = (y->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pnVar14 != pnVar4; pnVar14 = pnVar14 + 1
      ) {
    (pnVar14->m_backend).fpclass = cpp_dec_float_finite;
    (pnVar14->m_backend).prec_elem = 10;
    (pnVar14->m_backend).data._M_elems[0] = 0;
    (pnVar14->m_backend).data._M_elems[1] = 0;
    (pnVar14->m_backend).data._M_elems[2] = 0;
    (pnVar14->m_backend).data._M_elems[3] = 0;
    (pnVar14->m_backend).data._M_elems[4] = 0;
    (pnVar14->m_backend).data._M_elems[5] = 0;
    (pnVar14->m_backend).data._M_elems[6] = 0;
    (pnVar14->m_backend).data._M_elems[7] = 0;
    *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + 0x1d) = 0;
    *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + 0x25) = 0;
  }
  pnVar4 = (y2->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pnVar14 = (y2->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pnVar14 != pnVar4; pnVar14 = pnVar14 + 1
      ) {
    (pnVar14->m_backend).fpclass = cpp_dec_float_finite;
    (pnVar14->m_backend).prec_elem = 10;
    (pnVar14->m_backend).data._M_elems[0] = 0;
    (pnVar14->m_backend).data._M_elems[1] = 0;
    (pnVar14->m_backend).data._M_elems[2] = 0;
    (pnVar14->m_backend).data._M_elems[3] = 0;
    (pnVar14->m_backend).data._M_elems[4] = 0;
    (pnVar14->m_backend).data._M_elems[5] = 0;
    (pnVar14->m_backend).data._M_elems[6] = 0;
    (pnVar14->m_backend).data._M_elems[7] = 0;
    *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + 0x1d) = 0;
    *(undefined8 *)((long)(pnVar14->m_backend).data._M_elems + 0x25) = 0;
  }
  this->usetup = true;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(&this->ssvec);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::
  assign<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              *)&this->ssvec,b);
  if ((this->
      super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).l.updateType == 0) {
    iVar2 = (this->ssvec).super_IdxSet.num;
    local_68.m_backend.data._M_elems[9]._1_3_ = epsilon.m_backend.data._M_elems[9]._1_3_;
    local_68.m_backend.data._M_elems._32_5_ = epsilon.m_backend.data._M_elems._32_5_;
    local_68.m_backend.data._M_elems[7]._1_3_ = epsilon.m_backend.data._M_elems[7]._1_3_;
    local_68.m_backend.data._M_elems._24_5_ = epsilon.m_backend.data._M_elems._24_5_;
    local_68.m_backend.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
    local_68.m_backend.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
    local_68.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
    local_68.m_backend.data._M_elems[1] = epsilon.m_backend.data._M_elems[1];
    local_68.m_backend.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
    local_68.m_backend.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
    local_68.m_backend.exp = epsilon.m_backend.exp;
    local_68.m_backend.neg = epsilon.m_backend.neg;
    local_68.m_backend.fpclass = epsilon.m_backend.fpclass;
    local_68.m_backend.prec_elem = epsilon.m_backend.prec_elem;
    piVar5 = (x->super_IdxSet).idx;
    pnVar6 = (x->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    x->setupStatus = false;
    pnVar7 = (this->ssvec).
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar8 = (y->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_88 = CONCAT35(epsilon.m_backend.data._M_elems[9]._1_3_,
                        epsilon.m_backend.data._M_elems._32_5_);
    uStack_90 = CONCAT35(epsilon.m_backend.data._M_elems[7]._1_3_,
                         epsilon.m_backend.data._M_elems._24_5_);
    local_98[0] = epsilon.m_backend.data._M_elems[4];
    local_98[1] = epsilon.m_backend.data._M_elems[5];
    local_a8[0] = epsilon.m_backend.data._M_elems[0];
    local_a8[1] = epsilon.m_backend.data._M_elems[1];
    auStack_a0[0] = epsilon.m_backend.data._M_elems[2];
    auStack_a0[1] = epsilon.m_backend.data._M_elems[3];
    local_80 = epsilon.m_backend.exp;
    local_7c = epsilon.m_backend.neg;
    local_78 = epsilon.m_backend.fpclass;
    local_74 = epsilon.m_backend.prec_elem;
    rhs->setupStatus = false;
    pnVar14 = (rhs->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pnVar4 = (y2->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_c8 = CONCAT35(epsilon.m_backend.data._M_elems[9]._1_3_,
                        epsilon.m_backend.data._M_elems._32_5_);
    uStack_d0 = CONCAT35(epsilon.m_backend.data._M_elems[7]._1_3_,
                         epsilon.m_backend.data._M_elems._24_5_);
    local_d8[0] = epsilon.m_backend.data._M_elems[4];
    local_d8[1] = epsilon.m_backend.data._M_elems[5];
    local_e8[0] = epsilon.m_backend.data._M_elems[0];
    local_e8[1] = epsilon.m_backend.data._M_elems[1];
    auStack_e0[0] = epsilon.m_backend.data._M_elems[2];
    auStack_e0[1] = epsilon.m_backend.data._M_elems[3];
    local_c0 = epsilon.m_backend.exp;
    local_bc = epsilon.m_backend.neg;
    local_b8 = epsilon.m_backend.fpclass;
    local_b4 = epsilon.m_backend.prec_elem;
    rhs2->setupStatus = false;
    eps2_00.m_backend.data._M_elems._8_8_ = pnVar14;
    eps2_00.m_backend.data._M_elems._0_8_ = local_a8;
    eps2_00.m_backend.data._M_elems._16_8_ = piVar3;
    eps2_00.m_backend.data._M_elems[6] = iVar13;
    eps2_00.m_backend.data._M_elems[7] = in_stack_fffffffffffffd64;
    eps2_00.m_backend.data._M_elems._32_8_ = pnVar4;
    eps2_00.m_backend._40_8_ = local_e8;
    eps2_00.m_backend._48_8_ =
         (rhs2->
         super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).val.
         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    auVar12._8_4_ = iVar2;
    auVar12._0_8_ = uStack_258;
    auVar12._12_4_ = uStack_24c;
    auVar12._16_8_ = y;
    auVar12._24_8_ = pnVar6;
    auVar12._32_8_ = piVar5;
    auVar12._40_8_ = y2;
    auVar12._48_8_ = 0;
    iVar13 = CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::vSolveRight4update3
                       (&this->
                         super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ,&local_68,pnVar6,piVar5,pnVar7,ridx,iVar2,pnVar8,eps2_00,rhs2_00,
                        (int *)CONCAT44(uVar15,uVar1),0,
                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)0x0,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                )(auVar12 << 0x40),
                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)epsilon.m_backend.data._M_elems._0_8_,
                        (int *)epsilon.m_backend.data._M_elems._8_8_,
                        epsilon.m_backend.data._M_elems[4],
                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)CONCAT35(epsilon.m_backend.data._M_elems[7]._1_3_,
                                    epsilon.m_backend.data._M_elems._24_5_),
                        (int *)CONCAT35(epsilon.m_backend.data._M_elems[9]._1_3_,
                                        epsilon.m_backend.data._M_elems._32_5_),
                        (int *)CONCAT44(epsilon.m_backend._44_4_,epsilon.m_backend.exp));
    (x->super_IdxSet).num = iVar13;
    x->setupStatus = false;
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::
    setup_and_assign<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                *)&this->eta,x);
  }
  else {
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::clear(&this->forest);
    iVar2 = (this->ssvec).super_IdxSet.num;
    local_128.m_backend.data._M_elems[9]._1_3_ = epsilon.m_backend.data._M_elems[9]._1_3_;
    local_128.m_backend.data._M_elems._32_5_ = epsilon.m_backend.data._M_elems._32_5_;
    local_128.m_backend.data._M_elems[7]._1_3_ = epsilon.m_backend.data._M_elems[7]._1_3_;
    local_128.m_backend.data._M_elems._24_5_ = epsilon.m_backend.data._M_elems._24_5_;
    local_128.m_backend.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
    local_128.m_backend.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
    local_128.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
    local_128.m_backend.data._M_elems[1] = epsilon.m_backend.data._M_elems[1];
    local_128.m_backend.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
    local_128.m_backend.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
    local_128.m_backend.exp = epsilon.m_backend.exp;
    local_128.m_backend.neg = epsilon.m_backend.neg;
    local_128.m_backend.fpclass = epsilon.m_backend.fpclass;
    local_128.m_backend.prec_elem = epsilon.m_backend.prec_elem;
    piVar5 = (x->super_IdxSet).idx;
    pnVar6 = (x->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    x->setupStatus = false;
    pnVar7 = (this->ssvec).
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar8 = (y->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_148 = CONCAT35(epsilon.m_backend.data._M_elems[9]._1_3_,
                         epsilon.m_backend.data._M_elems._32_5_);
    uStack_150 = CONCAT35(epsilon.m_backend.data._M_elems[7]._1_3_,
                          epsilon.m_backend.data._M_elems._24_5_);
    local_158[0] = epsilon.m_backend.data._M_elems[4];
    local_158[1] = epsilon.m_backend.data._M_elems[5];
    local_168[0] = epsilon.m_backend.data._M_elems[0];
    local_168[1] = epsilon.m_backend.data._M_elems[1];
    auStack_160[0] = epsilon.m_backend.data._M_elems[2];
    auStack_160[1] = epsilon.m_backend.data._M_elems[3];
    local_140 = epsilon.m_backend.exp;
    local_13c = epsilon.m_backend.neg;
    local_138 = epsilon.m_backend.fpclass;
    local_134 = epsilon.m_backend.prec_elem;
    rhs->setupStatus = false;
    pnVar14 = (rhs->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pnVar4 = (y2->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    auStack_190[3]._1_3_ = epsilon.m_backend.data._M_elems[9]._1_3_;
    auStack_190._8_5_ = epsilon.m_backend.data._M_elems._32_5_;
    auStack_190[1]._1_3_ = epsilon.m_backend.data._M_elems[7]._1_3_;
    auStack_190._0_5_ = epsilon.m_backend.data._M_elems._24_5_;
    local_198[0] = epsilon.m_backend.data._M_elems[4];
    local_198[1] = epsilon.m_backend.data._M_elems[5];
    local_1a8[0] = epsilon.m_backend.data._M_elems[0];
    local_1a8[1] = epsilon.m_backend.data._M_elems[1];
    auStack_1a0[0] = epsilon.m_backend.data._M_elems[2];
    auStack_1a0[1] = epsilon.m_backend.data._M_elems[3];
    local_180 = epsilon.m_backend.exp;
    local_17c = epsilon.m_backend.neg;
    local_178 = epsilon.m_backend.fpclass;
    local_174 = epsilon.m_backend.prec_elem;
    rhs2->setupStatus = false;
    pnVar9 = (rhs2->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar10 = (this->forest).super_IdxSet.idx;
    pnVar11 = (this->forest).
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    (this->forest).setupStatus = false;
    eps2.m_backend.data._M_elems._8_8_ = pnVar14;
    eps2.m_backend.data._M_elems._0_8_ = local_168;
    eps2.m_backend.data._M_elems._16_8_ = piVar3;
    eps2.m_backend.data._M_elems[6] = iVar13;
    eps2.m_backend.data._M_elems[7] = 0;
    eps2.m_backend.data._M_elems._32_8_ = pnVar4;
    eps2.m_backend._40_8_ = local_1a8;
    eps2.m_backend._48_8_ = pnVar9;
    eps3.m_backend.data._M_elems._8_8_ = uStack_258;
    eps3.m_backend.data._M_elems._0_8_ = piVar10;
    eps3.m_backend.data._M_elems[4] = iVar2;
    eps3.m_backend.data._M_elems[5] = 0;
    eps3.m_backend.data._M_elems._24_8_ = pnVar8;
    eps3.m_backend.data._M_elems._32_8_ = piVar5;
    eps3.m_backend._40_8_ = pnVar14;
    eps3.m_backend._48_8_ = y2;
    iVar13 = CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::vSolveRight4update3
                       (&this->
                         super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ,&local_128,pnVar6,piVar5,pnVar7,ridx,iVar2,pnVar8,eps2,rhs2_00,
                        (int *)(ulong)uVar1,(int)pnVar11,
                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&f,eps3,
                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)epsilon.m_backend.data._M_elems._0_8_,
                        (int *)epsilon.m_backend.data._M_elems._8_8_,
                        epsilon.m_backend.data._M_elems[4],
                        (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)CONCAT35(epsilon.m_backend.data._M_elems[7]._1_3_,
                                    epsilon.m_backend.data._M_elems._24_5_),
                        (int *)CONCAT35(epsilon.m_backend.data._M_elems[9]._1_3_,
                                        epsilon.m_backend.data._M_elems._32_5_),
                        (int *)CONCAT44(epsilon.m_backend._44_4_,epsilon.m_backend.exp));
    (x->super_IdxSet).num = iVar13;
    x->setupStatus = true;
    (this->forest).super_IdxSet.num = f;
    (this->forest).setupStatus = true;
  }
  rhs->setupStatus = true;
  rhs2->setupStatus = true;
  (this->ssvec).super_IdxSet.num = 0;
  (this->ssvec).setupStatus = true;
  this->solveCount = this->solveCount + 3;
  (*this->solveTime->_vptr_Timer[4])();
  return;
}

Assistant:

void SLUFactor<R>::solve3right4update(
   SSVectorBase<R>&       x,
   VectorBase<R>&        y,
   VectorBase<R>&        y2,
   const SVectorBase<R>& b,
   SSVectorBase<R>&       rhs,
   SSVectorBase<R>&       rhs2)
{

   solveTime->start();

   int  m;
   int  n;
   int  f;
   int* sidx = ssvec.altIndexMem();
   ssvec.setSize(0);
   ssvec.forceSetup();
   int  rsize = rhs.size();
   int* ridx = rhs.altIndexMem();
   int  rsize2 = rhs2.size();
   int* ridx2 = rhs2.altIndexMem();
   R epsilon = this->tolerances()->epsilon();

   x.clear();
   y.clear();
   y2.clear();
   usetup = true;
   ssvec = b;

   if(this->l.updateType == ETA)
   {
      n = ssvec.size();
      m = this->vSolveRight4update3(epsilon,
                                    x.altValues(), x.altIndexMem(), ssvec.get_ptr(), sidx, n,
                                    y.get_ptr(), epsilon, rhs.altValues(), ridx, rsize,
                                    y2.get_ptr(), epsilon, rhs2.altValues(), ridx2, rsize2,
                                    nullptr, nullptr, nullptr);
      x.setSize(m);
      //      x.forceSetup();
      x.unSetup();
      eta.setup_and_assign(x);
   }
   else
   {
      forest.clear();
      n = ssvec.size();
      m = this->vSolveRight4update3(epsilon,
                                    x.altValues(), x.altIndexMem(), ssvec.get_ptr(), sidx, n,
                                    y.get_ptr(), epsilon, rhs.altValues(), ridx, rsize,
                                    y2.get_ptr(), epsilon, rhs2.altValues(), ridx2, rsize2,
                                    forest.altValues(), &f, forest.altIndexMem());
      x.setSize(m);
      x.forceSetup();
      forest.setSize(f);
      forest.forceSetup();
   }

   rhs.forceSetup();
   rhs2.forceSetup();
   ssvec.setSize(0);
   ssvec.forceSetup();

   solveCount += 3;
   solveTime->stop();
}